

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O3

void __thiscall agg::trans_double_path::trans_double_path(trans_double_path *this)

{
  (this->m_src_vertices1).super_pod_bvector<agg::vertex_dist,_6U>.m_size = 0;
  (this->m_src_vertices1).super_pod_bvector<agg::vertex_dist,_6U>.m_num_blocks = 0;
  (this->m_src_vertices1).super_pod_bvector<agg::vertex_dist,_6U>.m_max_blocks = 0;
  (this->m_src_vertices1).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks = (vertex_dist **)0x0;
  (this->m_src_vertices1).super_pod_bvector<agg::vertex_dist,_6U>.m_block_ptr_inc = 0x40;
  (this->m_src_vertices2).super_pod_bvector<agg::vertex_dist,_6U>.m_size = 0;
  (this->m_src_vertices2).super_pod_bvector<agg::vertex_dist,_6U>.m_num_blocks = 0;
  (this->m_src_vertices2).super_pod_bvector<agg::vertex_dist,_6U>.m_max_blocks = 0;
  (this->m_src_vertices2).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks = (vertex_dist **)0x0;
  (this->m_src_vertices2).super_pod_bvector<agg::vertex_dist,_6U>.m_block_ptr_inc = 0x40;
  *(undefined4 *)&this->m_base_length = 0;
  *(undefined4 *)((long)&this->m_base_length + 4) = 0;
  *(undefined4 *)&this->m_base_height = 0;
  *(undefined4 *)((long)&this->m_base_height + 4) = 0x3ff00000;
  this->m_kindex1 = 0.0;
  this->m_kindex2 = 0.0;
  this->m_status1 = initial;
  this->m_status2 = initial;
  this->m_preserve_x_scale = true;
  return;
}

Assistant:

trans_double_path::trans_double_path() :
        m_kindex1(0.0),
        m_kindex2(0.0),
        m_base_length(0.0),
        m_base_height(1.0),
        m_status1(initial),
        m_status2(initial),
        m_preserve_x_scale(true)
    {
    }